

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

value class_static_get(klass cls,char *key)

{
  accessor_type_id aVar1;
  anon_union_8_4_8a094f32_for_data aVar2;
  value pvVar3;
  size_t line;
  char *message;
  char *pcVar4;
  char *pcVar5;
  accessor_type accessor;
  
  if ((cls == (klass)0x0) || (cls->interface == (class_interface)0x0)) {
    return (value)0x0;
  }
  if (key == (char *)0x0) {
    return (value)0x0;
  }
  if (cls->interface->static_get == (class_impl_interface_static_get)0x0) {
    return (value)0x0;
  }
  aVar2.key = (char *)set_get(cls->static_attributes,key);
  if (aVar2.key == (char *)0x0) {
    if (cls->accessor == ACCESSOR_TYPE_DYNAMIC) {
      aVar1 = ACCESSOR_TYPE_DYNAMIC;
      accessor.data.key = key;
    }
    else {
      aVar1 = ACCESSOR_TYPE_DYNAMIC;
      if (cls->accessor == ACCESSOR_TYPE_STATIC) {
        message = "Static attribute %s in class %s is not defined";
        line = 0x1f7;
        pcVar5 = cls->name;
        pcVar4 = key;
        goto LAB_0011cf22;
      }
    }
  }
  else {
    aVar1 = ACCESSOR_TYPE_STATIC;
    accessor.data.key = aVar2.key;
  }
  accessor.id = aVar1;
  pvVar3 = (*cls->interface->static_get)(cls,cls->impl,&accessor);
  if (pvVar3 != (value)0x0) {
    return pvVar3;
  }
  message = "Invalid class %s get of static attribute %s";
  line = 0x20c;
  pcVar4 = cls->name;
  pcVar5 = key;
LAB_0011cf22:
  log_write_impl_va("metacall",line,"class_static_get",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                    ,LOG_LEVEL_ERROR,message,pcVar4,pcVar5);
  return (value)0x0;
}

Assistant:

value class_static_get(klass cls, const char *key)
{
	if (cls != NULL && cls->interface != NULL && cls->interface->static_get != NULL && key != NULL)
	{
		struct accessor_type accessor;
		attribute attr = set_get(cls->static_attributes, (set_key)key);

		if (attr == NULL)
		{
			switch (cls->accessor)
			{
				case ACCESSOR_TYPE_STATIC: {
					log_write("metacall", LOG_LEVEL_ERROR, "Static attribute %s in class %s is not defined", key, cls->name);
					return NULL;
				}

				case ACCESSOR_TYPE_DYNAMIC: {
					accessor.data.key = key;
				}
			}

			accessor.id = ACCESSOR_TYPE_DYNAMIC;
		}
		else
		{
			accessor.data.attr = attr;
			accessor.id = ACCESSOR_TYPE_STATIC;
		}

		value v = cls->interface->static_get(cls, cls->impl, &accessor);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class %s get of static attribute %s", cls->name, key);
		}

		return v;
	}

	return NULL;
}